

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::send_buffer(peer_connection *this,span<const_char> buf)

{
  int iVar1;
  bool bVar2;
  index_type iVar3;
  int *piVar4;
  span<const_char> buf_00;
  buffer local_90;
  span<const_char> local_80;
  int local_70;
  int local_6c;
  undefined1 local_68 [8];
  buffer snd_buf;
  char *local_50;
  char *dst;
  int local_28;
  int local_24;
  peer_connection *ppStack_20;
  int free_space;
  peer_connection *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (peer_connection *)buf.m_ptr;
  ppStack_20 = this;
  local_28 = chained_buffer::space_in_last_buffer(&this->m_send_buffer);
  iVar3 = span<const_char>::size((span<const_char> *)&this_local);
  dst._4_4_ = (undefined4)iVar3;
  piVar4 = ::std::min<int>(&local_28,(int *)((long)&dst + 4));
  local_24 = *piVar4;
  if (0 < local_24) {
    buf_00 = span<const_char>::first((span<const_char> *)&this_local,(long)local_24);
    chained_buffer::append(&this->m_send_buffer,buf_00);
    join_0x00000010_0x00000000_ =
         span<const_char>::subspan((span<const_char> *)&this_local,(long)local_24);
    this_local = (peer_connection *)snd_buf.m_size;
    buf_local.m_ptr = local_50;
  }
  bVar2 = span<const_char>::empty((span<const_char> *)&this_local);
  if (!bVar2) {
    iVar3 = span<const_char>::size((span<const_char> *)&this_local);
    local_6c = (int)iVar3;
    local_70 = 0x80;
    piVar4 = ::std::max<int>(&local_6c,&local_70);
    iVar1 = *piVar4;
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_80,(span<const_char> *)&this_local);
    aux::buffer::buffer((buffer *)local_68,(long)iVar1,local_80);
    aux::buffer::buffer(&local_90,(buffer *)local_68);
    iVar3 = span<const_char>::size((span<const_char> *)&this_local);
    chained_buffer::append_buffer<libtorrent::aux::buffer>
              (&this->m_send_buffer,&local_90,(int)iVar3);
    aux::buffer::~buffer(&local_90);
    setup_send(this);
    aux::buffer::~buffer((buffer *)local_68);
  }
  return;
}

Assistant:

void peer_connection::send_buffer(span<char const> buf)
	{
		TORRENT_ASSERT(is_single_thread());

		int const free_space = std::min(
			m_send_buffer.space_in_last_buffer(), int(buf.size()));
		if (free_space > 0)
		{
			char* dst = m_send_buffer.append(buf.first(free_space));

			// this should always succeed, because we checked how much space
			// there was up-front
			TORRENT_UNUSED(dst);
			TORRENT_ASSERT(dst != nullptr);
			buf = buf.subspan(free_space);
		}
		if (buf.empty()) return;

		// allocate a buffer and initialize the beginning of it with 'buf'
		aux::buffer snd_buf(std::max(int(buf.size()), 128), buf);
		m_send_buffer.append_buffer(std::move(snd_buf), int(buf.size()));

		setup_send();
	}